

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

void serialization::serialize<serialization::json_oarchive,Customize>
               (json_oarchive *ar,Customize *v)

{
  Customize *v_local;
  json_oarchive *ar_local;
  
  json_oarchive::serialize_start(ar);
  serialize_helper<serialization::json_oarchive,Customize>(ar,v);
  json_oarchive::serialize_end(ar);
  return;
}

Assistant:

void serialize(Archive & ar, const Value & v)
{
    ar.serialize_start();
    serialization::serialize_helper(ar, v);
    ar.serialize_end();
}